

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O1

uint32_t * FastPForLib::__fastpackwithoutmask23_8(uint32_t *in,uint32_t *out)

{
  uint uVar1;
  uint uVar2;
  
  uVar1 = *in;
  *out = uVar1;
  uVar2 = in[1];
  *out = uVar2 << 0x17 | uVar1;
  uVar2 = uVar2 >> 9;
  out[1] = uVar2;
  uVar1 = in[2];
  out[1] = uVar1 << 0xe | uVar2;
  uVar1 = uVar1 >> 0x12;
  out[2] = uVar1;
  uVar1 = in[3] << 5 | uVar1;
  out[2] = uVar1;
  uVar2 = in[4];
  out[2] = uVar2 << 0x1c | uVar1;
  uVar2 = uVar2 >> 4;
  out[3] = uVar2;
  uVar1 = in[5];
  out[3] = uVar1 << 0x13 | uVar2;
  uVar1 = uVar1 >> 0xd;
  out[4] = uVar1;
  uVar2 = in[6];
  out[4] = uVar2 << 10 | uVar1;
  uVar2 = uVar2 >> 0x16;
  out[5] = uVar2;
  out[5] = in[7] * 2 | uVar2;
  return out + 6;
}

Assistant:

uint32_t *__fastpackwithoutmask23_8(const uint32_t *__restrict__ in,
                                    uint32_t *__restrict__ out) {

  *out = (*in);
  ++in;
  *out |= ((*in)) << 23;
  ++out;
  *out = ((*in)) >> (23 - 14);
  ++in;
  *out |= ((*in)) << 14;
  ++out;
  *out = ((*in)) >> (23 - 5);
  ++in;
  *out |= ((*in)) << 5;
  ++in;
  *out |= ((*in)) << 28;
  ++out;
  *out = ((*in)) >> (23 - 19);
  ++in;
  *out |= ((*in)) << 19;
  ++out;
  *out = ((*in)) >> (23 - 10);
  ++in;
  *out |= ((*in)) << 10;
  ++out;
  *out = ((*in)) >> (23 - 1);
  ++in;
  *out |= ((*in)) << 1;
  ++in;

  return out + 1;
}